

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * __thiscall pbrt::AnimatedTransform::Interpolate(AnimatedTransform *this,Float time)

{
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Vector3,_float> t_00;
  void *in_RSI;
  Transform *in_RDI;
  float in_XMM0_Da;
  undefined1 auVar5 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar7 [56];
  Quaternion QVar8;
  Vector3<float> VVar9;
  SquareMatrix<4> scale;
  Quaternion rotate;
  Vector3f trans;
  Float dt;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 uVar10;
  Float s;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffbf8;
  SquareMatrix<4> *pSVar11;
  Transform *pTVar12;
  float in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc1c;
  Float in_stack_fffffffffffffc74;
  Transform *in_stack_fffffffffffffc78;
  Transform *in_stack_fffffffffffffc80;
  Quaternion in_stack_fffffffffffffc88;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffcbc;
  Transform *in_stack_fffffffffffffd10;
  Quaternion in_stack_fffffffffffffd18;
  SquareMatrix<4> local_1b8;
  undefined1 local_178 [128];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  SquareMatrix<4> *local_d0;
  Transform *pTStack_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  float local_28;
  undefined8 local_20;
  float local_18;
  float local_10;
  undefined1 auVar1 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  
  if (((*(byte *)((long)in_RSI + 0x108) & 1) == 0) ||
     (in_XMM0_Da <= *(float *)((long)in_RSI + 0x100))) {
    memcpy(in_RDI,in_RSI,0x80);
  }
  else if (in_XMM0_Da < *(float *)((long)in_RSI + 0x104)) {
    local_10 = (in_XMM0_Da - *(float *)((long)in_RSI + 0x100)) /
               (*(float *)((long)in_RSI + 0x104) - *(float *)((long)in_RSI + 0x100));
    uVar10 = 0x3f800000;
    auVar5 = (undefined1  [56])0x0;
    local_48 = *(undefined4 *)((long)in_RSI + 0x114);
    local_50 = *(undefined8 *)((long)in_RSI + 0x10c);
    t._4_8_ = in_stack_fffffffffffffc1c;
    t.x = in_stack_fffffffffffffc18;
    pTVar12 = in_RDI;
    local_40 = local_50;
    local_38 = local_48;
    VVar9 = pbrt::operator*((float)((ulong)in_RDI >> 0x20),t);
    local_58 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar1._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar1._8_56_ = auVar5;
    local_60 = vmovlpd_avx(auVar1._0_16_);
    auVar5 = (undefined1  [56])0x0;
    local_88 = *(undefined4 *)((long)in_RSI + 0x120);
    local_90 = *(undefined8 *)((long)in_RSI + 0x118);
    t_00.y = (float)(int)in_stack_fffffffffffffc1c;
    t_00.z = (float)(int)((ulong)in_stack_fffffffffffffc1c >> 0x20);
    t_00.x = in_stack_fffffffffffffc18;
    local_80 = local_90;
    local_78 = local_88;
    local_30 = local_60;
    local_28 = local_58;
    VVar9 = pbrt::operator*((float)((ulong)pTVar12 >> 0x20),t_00);
    local_a8 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar5;
    local_b0 = vmovlpd_avx(auVar2._0_16_);
    auVar5 = ZEXT856(0);
    VVar9.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc18;
    VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_RSI;
    local_a0 = local_b0;
    local_98 = local_a8;
    local_70 = local_b0;
    local_68 = local_a8;
    VVar9 = Tuple3<pbrt::Vector3,float>::operator+(in_stack_fffffffffffffbf8,VVar9);
    local_b8 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar3._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar5;
    local_c0 = vmovlpd_avx(auVar3._0_16_);
    auVar5 = (undefined1  [56])0x0;
    local_e8 = *(undefined8 *)((long)in_RSI + 0x124);
    uStack_e0 = *(undefined8 *)((long)in_RSI + 300);
    local_f8 = *(undefined8 *)((long)in_RSI + 0x134);
    uStack_f0 = *(undefined8 *)((long)in_RSI + 0x13c);
    auVar7 = ZEXT856(0);
    QVar8._8_8_ = in_stack_fffffffffffffc80;
    QVar8.v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffc78;
    local_20 = local_c0;
    local_18 = local_b8;
    QVar8 = Slerp(in_stack_fffffffffffffc74,in_stack_fffffffffffffc88,QVar8);
    auVar6._0_8_ = QVar8._8_8_;
    auVar6._8_56_ = auVar7;
    auVar4._0_8_ = QVar8.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar5;
    local_d0 = (SquareMatrix<4> *)vmovlpd_avx(auVar4._0_16_);
    pTStack_c8 = (Transform *)vmovlpd_avx(auVar6._0_16_);
    s = (Float)((ulong)local_178 >> 0x20);
    pbrt::operator*(s,(SquareMatrix<4> *)CONCAT44(uVar10,in_stack_fffffffffffffbe8));
    pSVar11 = &local_1b8;
    pbrt::operator*(s,(SquareMatrix<4> *)CONCAT44(uVar10,in_stack_fffffffffffffbe8));
    SquareMatrix<4>::operator+(&pTVar12->m,pSVar11);
    Translate((Vector3f)in_stack_fffffffffffffcbc);
    pSVar11 = local_d0;
    pTVar12 = pTStack_c8;
    Transform::Transform(in_stack_fffffffffffffd10,in_stack_fffffffffffffd18);
    Transform::operator*(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    Transform::Transform(pTVar12,pSVar11);
    Transform::operator*(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  }
  else {
    memcpy(in_RDI,(void *)((long)in_RSI + 0x80),0x80);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU Transform AnimatedTransform::Interpolate(Float time) const {
    // Handle boundary conditions for matrix interpolation
    if (!actuallyAnimated || time <= startTime)
        return startTransform;
    if (time >= endTime)
        return endTransform;

    Float dt = (time - startTime) / (endTime - startTime);
    // Interpolate translation at _dt_
    Vector3f trans = (1 - dt) * T[0] + dt * T[1];

    // Interpolate rotation at _dt_
    Quaternion rotate = Slerp(dt, R[0], R[1]);

    // Interpolate scale at _dt_
    SquareMatrix<4> scale = (1 - dt) * S[0] + dt * S[1];

    // Return interpolated matrix as product of interpolated components
    return Translate(trans) * Transform(rotate) * Transform(scale);
}